

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Timing.cpp
# Opt level: O0

void __thiscall soul::ScopedTimer::ScopedTimer(ScopedTimer *this,string *desc)

{
  rep rVar1;
  string *desc_local;
  ScopedTimer *this_local;
  
  std::__cxx11::string::string((string *)this,(string *)desc);
  rVar1 = std::chrono::_V2::system_clock::now();
  (this->start).__d.__r = rVar1;
  return;
}

Assistant:

ScopedTimer::ScopedTimer (std::string desc) noexcept  : description (std::move (desc)) {}